

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall btCollisionWorld::~btCollisionWorld(btCollisionWorld *this)

{
  btCollisionObject *pbVar1;
  btBroadphaseProxy *pbVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  
  this->_vptr_btCollisionWorld = (_func_int **)&PTR__btCollisionWorld_0021b9e0;
  iVar3 = (this->m_collisionObjects).m_size;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pbVar1 = (this->m_collisionObjects).m_data[lVar4];
      pbVar2 = pbVar1->m_broadphaseHandle;
      if (pbVar2 != (btBroadphaseProxy *)0x0) {
        iVar3 = (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[9])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x50))
                  ((long *)CONCAT44(extraout_var,iVar3),pbVar2,this->m_dispatcher1);
        (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[3])
                  (this->m_broadphasePairCache,pbVar2,this->m_dispatcher1);
        pbVar1->m_broadphaseHandle = (btBroadphaseProxy *)0x0;
        iVar3 = (this->m_collisionObjects).m_size;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  btAlignedObjectArray<btCollisionObject_*>::~btAlignedObjectArray(&this->m_collisionObjects);
  return;
}

Assistant:

btCollisionWorld::~btCollisionWorld()
{

	//clean up remaining objects
	int i;
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* collisionObject= m_collisionObjects[i];

		btBroadphaseProxy* bp = collisionObject->getBroadphaseHandle();
		if (bp)
		{
			//
			// only clear the cached algorithms
			//
			getBroadphase()->getOverlappingPairCache()->cleanProxyFromPairs(bp,m_dispatcher1);
			getBroadphase()->destroyProxy(bp,m_dispatcher1);
			collisionObject->setBroadphaseHandle(0);
		}
	}


}